

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O2

bool __thiscall ON_Curve::FrameAt(ON_Curve *this,double t,ON_Plane *plane)

{
  ON_3dVector *b;
  bool bVar1;
  double *pdVar2;
  ON_3dVector K;
  ON_3dVector T;
  ON_3dPoint pt;
  ON_Interval domain;
  ON_3dVector local_70;
  ON_3dVector d2;
  ON_3dVector d1;
  
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  pdVar2 = ON_Interval::operator[](&domain,0);
  if ((((*pdVar2 + -2.220446049250313e-16 <= t) &&
       (pdVar2 = ON_Interval::operator[](&domain,1), t <= *pdVar2 + 2.220446049250313e-16)) &&
      (bVar1 = Ev2Der(this,t,&pt,&d1,&d2,0,(int *)0x0), bVar1)) &&
     (bVar1 = ON_EvCurvature(&d1,&d2,&T,&K), bVar1)) {
    bVar1 = ON_3dVector::Unitize(&K);
    if (!bVar1) {
      ON_3dVector::PerpendicularTo(&K,&T);
      ON_3dVector::Unitize(&K);
    }
    (plane->origin).z = pt.z;
    (plane->origin).x = pt.x;
    (plane->origin).y = pt.y;
    (plane->xaxis).x = T.x;
    (plane->xaxis).y = T.y;
    (plane->xaxis).z = T.z;
    b = &plane->yaxis;
    (plane->yaxis).x = K.x;
    (plane->yaxis).y = K.y;
    (plane->yaxis).z = K.z;
    ON_CrossProduct(&local_70,&plane->xaxis,b);
    (plane->zaxis).z = local_70.z;
    (plane->zaxis).x = local_70.x;
    (plane->zaxis).y = local_70.y;
    bVar1 = ON_3dVector::Unitize(&plane->zaxis);
    if (bVar1) {
      ON_Plane::UpdateEquation(plane);
      bVar1 = ON_Plane::IsValid(plane);
      if (!bVar1) {
        ON_CrossProduct(&local_70,&plane->zaxis,&plane->xaxis);
        (plane->yaxis).z = local_70.z;
        b->x = local_70.x;
        (plane->yaxis).y = local_70.y;
        ON_3dVector::Unitize(b);
        bVar1 = ON_Plane::UpdateEquation(plane);
        return bVar1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Curve::FrameAt( double t, ON_Plane& plane) const
{
  bool rc = false;
  ON_Interval domain = Domain();
  if( t < domain[0] - ON_EPSILON || t > domain[1] + ON_EPSILON)
    return false;

  ON_3dPoint pt;
  ON_3dVector d1, d2;
  rc = Ev2Der( t, pt, d1, d2 );
  if (rc)
  {
    ON_3dVector T, K;
    rc = ON_EvCurvature(d1, d2, T, K);
    if (rc)
    {
      if (!K.Unitize())
      {
        K.PerpendicularTo(T);
        K.Unitize();
      }
      plane.origin = pt;
      plane.xaxis = T;
      plane.yaxis = K;
      plane.zaxis = ON_CrossProduct(plane.xaxis, plane.yaxis);
      if (!plane.zaxis.Unitize())
        return false;
      plane.UpdateEquation();
      rc = plane.IsValid();
      if (!rc)
      {
        //26 Aug 2015 - Chuck - If K is extremely short, but can still be unitized, the result may not be perpendicular to T.
        plane.yaxis = ON_CrossProduct(plane.zaxis, plane.xaxis);
        plane.yaxis.Unitize();
        rc = plane.UpdateEquation();
      }
    }
  }
  return rc;
}